

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O2

bool __thiscall dg::LLVMDependenceGraph::addFormalGlobal(LLVMDependenceGraph *this,Value *val)

{
  Value *pVVar1;
  LLVMDGParameters *this_00;
  DGParameterPair<dg::LLVMNode> *pDVar2;
  Value *pVVar3;
  LLVMNode *pLVar4;
  pair<dg::LLVMNode_*,_dg::LLVMNode_*> pVar5;
  
  this_00 = getOrCreateParameters(this);
  pDVar2 = DGParameters<dg::LLVMNode>::find(this_00,val);
  if (pDVar2 == (DGParameterPair<dg::LLVMNode> *)0x0) {
    pVar5 = DGParameters<dg::LLVMNode>::constructGlobal<llvm::Value*,dg::LLVMDependenceGraph*>
                      (this_00,val,val,this);
    pLVar4 = (this->super_DependenceGraph<dg::LLVMNode>).entryNode;
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
              (&pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pVar5.first
              );
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
              (&pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
               pVar5.second);
    pVVar1 = (pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
    pVVar3 = (Value *)0x0;
    if (pVVar1[0x10] == (Value)0x0) {
      pVVar3 = pVVar1;
    }
    if ((pVVar3 != (Value *)0x0) && (pVVar3 == (Value *)this->entryFunction)) {
      pLVar4 = DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
                         (&this->super_DependenceGraph<dg::LLVMNode>,val);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                (&pLVar4->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                 pVar5.first);
    }
  }
  return pDVar2 == (DGParameterPair<dg::LLVMNode> *)0x0;
}

Assistant:

bool LLVMDependenceGraph::addFormalGlobal(llvm::Value *val) {
    // add the same formal parameters
    LLVMDGParameters *params = getOrCreateParameters();
    assert(params);

    // if we have this value, just return
    if (params->find(val))
        return false;

    LLVMNode *fpin, *fpout;
    std::tie(fpin, fpout) = params->constructGlobal(val, val, this);
    assert(fpin && fpout);
    assert(fpin->getDG() == this && fpout->getDG() == this);

    LLVMNode *entry = getEntry();
    entry->addControlDependence(fpin);
    entry->addControlDependence(fpout);

    // if these are the formal parameters of the main
    // function, add control dependence also between the
    // global as the formal input parameter representing this global
    if (llvm::Function *F = llvm::dyn_cast<llvm::Function>(entry->getValue())) {
        if (F == entryFunction) {
            auto *gnode = getGlobalNode(val);
            assert(gnode);
            gnode->addControlDependence(fpin);
        }
    }

    return true;
}